

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O1

void __thiscall Pl_Base64::flush_encode(Pl_Base64 *this)

{
  byte bVar1;
  size_t sVar2;
  Pipeline *pPVar3;
  size_t i;
  long lVar4;
  byte bVar5;
  uchar out [4];
  byte local_c [4];
  
  local_c[0] = (byte)*(int *)this->buf >> 2;
  local_c[1] = (byte)(((uint)this->buf[1] << 8 | *(int *)this->buf << 0x10) >> 0xc) & 0x3f;
  local_c[2] = (byte)(CONCAT11(this->buf[1],this->buf[2]) >> 6) & 0x3f;
  local_c[3] = this->buf[2] & 0x3f;
  lVar4 = 0;
  do {
    bVar1 = local_c[lVar4];
    if (bVar1 < 0x1a) {
      bVar5 = bVar1 + 0x41;
    }
    else if (bVar1 < 0x34) {
      bVar5 = bVar1 + 0x47;
    }
    else if (bVar1 < 0x3e) {
      bVar5 = bVar1 - 4;
    }
    else {
      bVar5 = 0x2b;
      if ((bVar1 != 0x3e) && (bVar5 = bVar1, bVar1 == 0x3f)) {
        bVar5 = 0x2f;
      }
    }
    local_c[lVar4] = bVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  sVar2 = this->pos;
  if (sVar2 != 3) {
    memset(local_c + sVar2 + 1,0x3d,3 - sVar2);
  }
  pPVar3 = (this->super_Pipeline).next_;
  (*pPVar3->_vptr_Pipeline[2])(pPVar3,local_c,4);
  return;
}

Assistant:

void
Pl_Base64::flush_encode()
{
    int outval = ((this->buf[0] << 16) | (this->buf[1] << 8) | (this->buf[2]));
    unsigned char out[4] = {
        to_uc(outval >> 18),
        to_uc(0x3f & (outval >> 12)),
        to_uc(0x3f & (outval >> 6)),
        to_uc(0x3f & outval),
    };
    for (size_t i = 0; i < 4; ++i) {
        int ch = to_i(out[i]);
        if (ch < 26) {
            ch += 'A';
        } else if (ch < 52) {
            ch -= 26;
            ch += 'a';
        } else if (ch < 62) {
            ch -= 52;
            ch += '0';
        } else if (ch == 62) {
            ch = '+';
        } else if (ch == 63) {
            ch = '/';
        }
        out[i] = to_uc(ch);
    }
    for (size_t i = 0; i < 3 - this->pos; ++i) {
        out[3 - i] = '=';
    }
    next()->write(out, 4);
}